

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

pair<const_char_*,_int> google::protobuf::internal::ReadSizeFallback(char *p,uint32 res)

{
  ulong uVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  pair<const_char_*,_int> pVar9;
  
  uVar7 = (ulong)(((uint)(byte)p[1] * 0x80 + res) - 0x80);
  if (p[1] < '\0') {
    bVar5 = 0xe;
    uVar1 = 0;
    do {
      uVar4 = uVar1;
      if (uVar4 == 2) {
        pcVar3 = (char *)0x3;
        bVar8 = true;
        goto LAB_0020934f;
      }
      uVar7 = (ulong)((int)uVar7 + ((byte)p[uVar4 + 2] - 1 << (bVar5 & 0x1f)));
      bVar5 = bVar5 + 7;
      uVar1 = uVar4 + 1;
    } while (p[uVar4 + 2] < '\0');
    bVar8 = 2 < uVar4 + 1;
    lVar2 = uVar4 + 2;
  }
  else {
    lVar2 = 1;
    bVar8 = false;
  }
  pcVar3 = p + lVar2 + 1;
LAB_0020934f:
  if (bVar8) {
    if ((byte)p[4] < 8) {
      uVar6 = (int)uVar7 + (uint)(byte)p[4] * 0x10000000 + 0xf0000000;
      pcVar3 = (char *)0x0;
      if (uVar6 < 0x7ffffff0) {
        pcVar3 = p + 5;
      }
      uVar7 = (ulong)uVar6;
      if (uVar6 >= 0x7ffffff0) {
        uVar7 = 0;
      }
    }
    else {
      pcVar3 = (char *)0x0;
      uVar7 = 0;
    }
  }
  pVar9._8_8_ = uVar7;
  pVar9.first = pcVar3;
  return pVar9;
}

Assistant:

std::pair<const char*, int32> ReadSizeFallback(const char* p, uint32 res) {
  for (std::uint32_t i = 1; i < 4; i++) {
    uint32 byte = static_cast<uint8>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  std::uint32_t byte = static_cast<uint8>(p[4]);
  if (PROTOBUF_PREDICT_FALSE(byte >= 8)) return {nullptr, 0};  // size >= 2gb
  res += (byte - 1) << 28;
  // Protect against sign integer overflow in PushLimit. Limits are relative
  // to buffer ends and ptr could potential be kSlopBytes beyond a buffer end.
  // To protect against overflow we reject limits absurdly close to INT_MAX.
  if (PROTOBUF_PREDICT_FALSE(res > INT_MAX - ParseContext::kSlopBytes)) {
    return {nullptr, 0};
  }
  return {p + 5, res};
}